

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O0

void __thiscall Assimp::XFileParser::ParseDataObjectFrame(XFileParser *this,Node *pParent)

{
  bool bVar1;
  Node *pNVar2;
  long lVar3;
  Mesh *this_00;
  Logger *this_01;
  Mesh *local_b0;
  Mesh *mesh;
  string local_a0;
  undefined1 local_80 [8];
  string objectName;
  Node *pNStack_58;
  bool running;
  Node *exroot;
  Node *node;
  undefined1 local_38 [8];
  string name;
  Node *pParent_local;
  XFileParser *this_local;
  
  name.field_2._8_8_ = pParent;
  std::__cxx11::string::string((string *)local_38);
  readHeadOfDataObject(this,(string *)local_38);
  pNVar2 = (Node *)operator_new(0x98);
  XFile::Node::Node(pNVar2,(Node *)name.field_2._8_8_);
  exroot = pNVar2;
  std::__cxx11::string::operator=((string *)pNVar2,(string *)local_38);
  if (name.field_2._8_8_ == 0) {
    if (this->mScene->mRootNode == (Node *)0x0) {
      this->mScene->mRootNode = exroot;
    }
    else {
      bVar1 = std::operator!=(&this->mScene->mRootNode->mName,"$dummy_root");
      if (bVar1) {
        pNStack_58 = this->mScene->mRootNode;
        pNVar2 = (Node *)operator_new(0x98);
        XFile::Node::Node(pNVar2,(Node *)0x0);
        this->mScene->mRootNode = pNVar2;
        std::__cxx11::string::operator=((string *)this->mScene->mRootNode,"$dummy_root");
        std::vector<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>::push_back
                  (&this->mScene->mRootNode->mChildren,&stack0xffffffffffffffa8);
        pNStack_58->mParent = this->mScene->mRootNode;
      }
      std::vector<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>::push_back
                (&this->mScene->mRootNode->mChildren,&exroot);
      exroot->mParent = this->mScene->mRootNode;
    }
  }
  else {
    std::vector<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>::push_back
              ((vector<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_> *)
               (name.field_2._8_8_ + 0x68),&exroot);
  }
  objectName.field_2._M_local_buf[0xf] = '\x01';
  do {
    if ((objectName.field_2._M_local_buf[0xf] & 1U) == 0) break;
    GetNextToken_abi_cxx11_((string *)local_80,this);
    lVar3 = std::__cxx11::string::size();
    if (lVar3 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"Unexpected end of file reached while parsing frame",
                 (allocator<char> *)((long)&mesh + 7));
      ThrowException(this,&local_a0);
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_80,"}");
    if (bVar1) {
      mesh._0_4_ = 3;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_80,"Frame");
      if (bVar1) {
        ParseDataObjectFrame(this,exroot);
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_80,"FrameTransformMatrix");
        if (bVar1) {
          ParseDataObjectTransformationMatrix(this,&exroot->mTrafoMatrix);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_80,"Mesh");
          if (bVar1) {
            this_00 = (Mesh *)operator_new(600);
            XFile::Mesh::Mesh(this_00,(string *)local_38);
            local_b0 = this_00;
            std::vector<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>::push_back
                      (&exroot->mMeshes,&local_b0);
            ParseDataObjectMesh(this,local_b0);
          }
          else {
            this_01 = DefaultLogger::get();
            Logger::warn(this_01,"Unknown data object in frame in x file");
            ParseUnknownDataObject(this);
          }
        }
      }
      mesh._0_4_ = 0;
    }
    std::__cxx11::string::~string((string *)local_80);
  } while ((int)mesh == 0);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void XFileParser::ParseDataObjectFrame( Node* pParent)
{
    // A coordinate frame, or "frame of reference." The Frame template
    // is open and can contain any object. The Direct3D extensions (D3DX)
    // mesh-loading functions recognize Mesh, FrameTransformMatrix, and
    // Frame template instances as child objects when loading a Frame
    // instance.
    std::string name;
    readHeadOfDataObject(&name);

    // create a named node and place it at its parent, if given
    Node* node = new Node( pParent);
    node->mName = name;
    if( pParent)
    {
        pParent->mChildren.push_back( node);
    } else
    {
        // there might be multiple root nodes
        if( mScene->mRootNode != NULL)
        {
            // place a dummy root if not there
            if( mScene->mRootNode->mName != "$dummy_root")
            {
                Node* exroot = mScene->mRootNode;
                mScene->mRootNode = new Node( NULL);
                mScene->mRootNode->mName = "$dummy_root";
                mScene->mRootNode->mChildren.push_back( exroot);
                exroot->mParent = mScene->mRootNode;
            }
            // put the new node as its child instead
            mScene->mRootNode->mChildren.push_back( node);
            node->mParent = mScene->mRootNode;
        } else
        {
            // it's the first node imported. place it as root
            mScene->mRootNode = node;
        }
    }

    // Now inside a frame.
    // read tokens until closing brace is reached.
    bool running = true;
    while ( running )
    {
        std::string objectName = GetNextToken();
        if (objectName.size() == 0)
            ThrowException( "Unexpected end of file reached while parsing frame");

        if( objectName == "}")
            break; // frame finished
        else
        if( objectName == "Frame")
            ParseDataObjectFrame( node); // child frame
        else
        if( objectName == "FrameTransformMatrix")
            ParseDataObjectTransformationMatrix( node->mTrafoMatrix);
        else
        if( objectName == "Mesh")
        {
            Mesh* mesh = new Mesh(name);
            node->mMeshes.push_back( mesh);
            ParseDataObjectMesh( mesh);
        } else
        {
            ASSIMP_LOG_WARN("Unknown data object in frame in x file");
            ParseUnknownDataObject();
        }
    }
}